

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O0

istream * nuraft::operator>>(istream *in,buffer *buf)

{
  ulong uVar1;
  error_code *this;
  size_t sVar2;
  char *pcVar3;
  buffer *in_RSI;
  istream *in_RDI;
  int size;
  char *data;
  undefined8 in_stack_ffffffffffffff88;
  error_code *in_stack_ffffffffffffff90;
  undefined1 local_50 [20];
  int local_3c;
  byte *local_38;
  buffer *local_10;
  istream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  uVar1 = std::ios::operator!((ios *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  if ((uVar1 & 1) != 0) {
    pcVar3 = (char *)__cxa_allocate_exception(0x20);
    std::error_code::error_code<std::io_errc,void>
              (in_stack_ffffffffffffff90,(io_errc)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    std::ios_base::failure[abi:cxx11]::failure(pcVar3,(error_code *)"bad input stream");
    __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
  local_38 = buffer::data(local_10);
  this = (error_code *)buffer::size(local_10);
  sVar2 = buffer::pos(local_10);
  local_3c = (int)this - (int)sVar2;
  std::istream::read((char *)local_8,(long)local_38);
  uVar1 = std::ios::operator!((ios *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  if ((uVar1 & 1) == 0) {
    return local_8;
  }
  pcVar3 = (char *)__cxa_allocate_exception(0x20);
  std::error_code::error_code<std::io_errc,void>(this,(io_errc)((ulong)local_50 >> 0x20));
  std::ios_base::failure[abi:cxx11]::failure(pcVar3,(error_code *)"read failed");
  __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
              std::ios_base::failure[abi:cxx11]::~failure);
}

Assistant:

std::istream& nuraft::operator >> (std::istream& in, buffer& buf) {
    if (!in) {
        throw std::ios::failure("bad input stream");
    }

    char* data = reinterpret_cast<char*>(buf.data());
    int size = buf.size() - buf.pos();
    in.read(data, size);

    if (!in) {
        throw std::ios::failure("read failed");
    }

    return in;
}